

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
::TestBody(SubjectSetRegisterTest_test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync_Test
           *this)

{
  char *in_R9;
  AssertHelper AStack_218;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  AssertionResult gtest_ar_;
  _Storage<bidfx_public_api::price::pixie::SubscriptionSync,_false> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  SubjectSetRegister subject_register;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_128,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_128,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_140,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_140,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  gtest_ar_.success_ =
       (bool)(message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged !=
      false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8._M_value,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x17d,(char *)local_1f8._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    std::__cxx11::string::~string((string *)&local_1f8._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_158,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_158,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_170,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_170,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_170);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_move_assign
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message,
             (_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_1f8._M_value);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_1f8._M_value);
  gtest_ar_.success_ =
       (bool)(message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged !=
      false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8._M_value,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x185,(char *)local_1f8._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    std::__cxx11::string::~string((string *)&local_1f8._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_188,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_188,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_move_assign
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message,
             (_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_1f8._M_value);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_1f8._M_value);
  gtest_ar_.success_ =
       (bool)(message.
              super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
              _M_payload.
              super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>
              .super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>.
              _M_engaged ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (message.super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>.
      _M_payload.
      super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
      super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged !=
      false) {
    testing::Message::Message((Message *)&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1f8._M_value,(internal *)&gtest_ar_,(AssertionResult *)0x1f6f66,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x18b,(char *)local_1f8._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    std::__cxx11::string::~string((string *)&local_1f8._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_210);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)&message);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_subscribe_then_unsubscribe_quickly_this_should_never_result_in_a_subscription_sync)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, true);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);

    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Unregister(SS_SUBJECT2);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message);
}